

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::BufferBase<Diligent::EngineGLImplTraits>::BufferBase
          (BufferBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          TBuffViewObjAllocator *BuffViewObjAllocator,RenderDeviceImplType *pDevice,
          BufferDesc *BuffDesc,bool bIsDeviceInternal)

{
  Uint64 *Args_1;
  Uint32 UVar1;
  RenderDeviceGLImpl *pDevice_00;
  ulong uVar2;
  string msg;
  _Alloc_hider in_stack_ffffffffffffffc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  char local_20 [8];
  
  DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                   ,pRefCounters,pDevice,BuffDesc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>).
  super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
  super_IBuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00424958;
  this->m_dbgBuffViewAllocator = BuffViewObjAllocator;
  this->m_State = RESOURCE_STATE_UNKNOWN;
  this->m_MemoryProperties = MEMORY_PROPERTY_UNKNOWN;
  this->m_DynamicBufferId = 0xffffffff;
  (this->m_pDefaultUAV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .
  super__Tuple_impl<1UL,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .
  super__Head_base<1UL,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>,_false>
  ._M_head_impl =
       (STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>)
       BuffViewObjAllocator;
  (this->m_pDefaultUAV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl = (BufferViewGLImpl *)0x0
  ;
  (this->m_pDefaultSRV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .
  super__Tuple_impl<1UL,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .
  super__Head_base<1UL,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>,_false>
  ._M_head_impl =
       (STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>)
       BuffViewObjAllocator;
  (this->m_pDefaultSRV)._M_t.
  super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
  .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl = (BufferViewGLImpl *)0x0
  ;
  pDevice_00 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                          );
  ValidateBufferDesc(&(this->
                      super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                      ).m_Desc,(IRenderDevice *)pDevice_00);
  DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>::
  GetDevice(&this->
             super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
           );
  uVar2 = 1;
  if (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.ImmediateContextMask & 1) == 0) {
    DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>::
    GetDevice(&this->
               super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             );
    Args_1 = &(this->
              super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
              ).m_Desc.ImmediateContextMask;
    local_20[0] = '\x01';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\0';
    local_20[4] = '\0';
    local_20[5] = '\0';
    local_20[6] = '\0';
    local_20[7] = '\0';
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              ((string *)&stack0xffffffffffffffc0,
               (Diligent *)"No bits in the immediate context mask (0x",(char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)Args_1,(unsigned_long *)") correspond to one of ",
               (char (*) [24])local_20,(unsigned_long *)" available software command queues",
               (char (*) [35])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"BufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x66);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
    uVar2 = (ulong)((uint)*Args_1 & 1);
  }
  (this->
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>).
  m_Desc.ImmediateContextMask = uVar2;
  if ((this->
      super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
      ).m_Desc.Usage == USAGE_DYNAMIC) {
    UVar1 = RenderDeviceBase<Diligent::EngineGLImplTraits>::AllocateDynamicBufferId
                      (&pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    this->m_DynamicBufferId = UVar1;
  }
  return;
}

Assistant:

BufferBase(IReferenceCounters*    pRefCounters,
               TBuffViewObjAllocator& BuffViewObjAllocator,
               RenderDeviceImplType*  pDevice,
               const BufferDesc&      BuffDesc,
               bool                   bIsDeviceInternal) :
        TDeviceObjectBase{pRefCounters, pDevice, BuffDesc, bIsDeviceInternal},
#ifdef DILIGENT_DEBUG
        m_dbgBuffViewAllocator{BuffViewObjAllocator},
#endif
        m_pDefaultUAV{nullptr, STDDeleter<BufferViewImplType, TBuffViewObjAllocator>(BuffViewObjAllocator)},
        m_pDefaultSRV{nullptr, STDDeleter<BufferViewImplType, TBuffViewObjAllocator>(BuffViewObjAllocator)}
    {
        ValidateBufferDesc(this->m_Desc, this->GetDevice()); // May throw

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;

        if (this->m_Desc.Usage == USAGE_DYNAMIC)
        {
            m_DynamicBufferId = pDevice->AllocateDynamicBufferId();
        }
    }